

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O0

int genquad(optype intopcode,addressrec a,addressrec b,addressrec c)

{
  long lVar1;
  optype intopcode_local;
  addressrec c_local;
  addressrec b_local;
  addressrec a_local;
  
  intcode[numcodes].opcode = intopcode;
  b_local.opndtype = a.opndtype;
  intcode[numcodes].op1.opndtype = b_local.opndtype;
  b_local.opnd = a.opnd;
  intcode[numcodes].op1.opnd = b_local.opnd;
  intcode[numcodes].op2 = b;
  lVar1 = (long)numcodes;
  numcodes = numcodes + 1;
  intcode[lVar1].op3 = c;
  return numcodes + -1;
}

Assistant:

int	genquad(enum optype intopcode, struct addressrec a,
            struct addressrec b, struct addressrec c)
{
    intcode[numcodes].opcode = intopcode;
    intcode[numcodes].op1.opndtype = a.opndtype;
    intcode[numcodes].op1.opnd = a.opnd;
    intcode[numcodes].op2 = b;
    intcode[numcodes++].op3 = c;
    return(numcodes-1);
}